

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layers.h
# Opt level: O0

void __thiscall
dlib::con_<2048L,_1L,_1L,_1,_1,_0,_0>::con_(con_<2048L,_1L,_1L,_1,_1,_0,_0> *this,num_con_outputs o)

{
  ostream *poVar1;
  ostream *poVar2;
  string *a;
  undefined8 uVar3;
  undefined8 in_RSI;
  long in_RDI;
  ostringstream dlib_o_out;
  resizable_tensor *in_stack_fffffffffffffde0;
  error_type t;
  ostringstream local_198 [400];
  undefined8 local_8;
  
  local_8 = in_RSI;
  resizable_tensor::resizable_tensor(in_stack_fffffffffffffde0);
  alias_tensor::alias_tensor((alias_tensor *)0x1243e7);
  alias_tensor::alias_tensor((alias_tensor *)0x1243ff);
  tt::tensor_conv::tensor_conv((tensor_conv *)0x124412);
  *(undefined8 *)(in_RDI + 0x148) = 0x3ff0000000000000;
  *(undefined8 *)(in_RDI + 0x150) = 0x3ff0000000000000;
  *(undefined8 *)(in_RDI + 0x158) = 0x3ff0000000000000;
  *(undefined8 *)(in_RDI + 0x160) = 0;
  *(undefined8 *)(in_RDI + 0x168) = local_8;
  *(undefined4 *)(in_RDI + 0x170) = 0;
  *(undefined4 *)(in_RDI + 0x174) = 0;
  *(undefined1 *)(in_RDI + 0x178) = 1;
  *(undefined1 *)(in_RDI + 0x179) = 0;
  if (*(long *)(in_RDI + 0x168) < 1) {
    dlib_assert_breakpoint();
    std::__cxx11::ostringstream::ostringstream(local_198);
    poVar1 = std::operator<<((ostream *)local_198,"\n\nError detected at line ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x43);
    std::operator<<(poVar1,".\n");
    poVar1 = std::operator<<((ostream *)local_198,"Error detected in file ");
    poVar1 = std::operator<<(poVar1,
                             "/workspace/llm4binary/github/license_c_cmakelists/arrufat[P]dlib-pytorch-benchmark/external/dlib/dlib/../dlib/dnn/layers.h"
                            );
    std::operator<<(poVar1,".\n");
    poVar1 = std::operator<<((ostream *)local_198,"Error detected in function ");
    poVar1 = std::operator<<(poVar1,
                             "dlib::con_<2048, 1, 1, 1, 1>::con_(num_con_outputs) [_num_filters = 2048, _nr = 1, _nc = 1, _stride_y = 1, _stride_x = 1, _padding_y = 0, _padding_x = 0]"
                            );
    std::operator<<(poVar1,".\n\n");
    poVar2 = std::operator<<((ostream *)local_198,"Failing expression was ");
    a = (string *)std::operator<<(poVar2,"num_filters_ > 0");
    t = (error_type)((ulong)poVar2 >> 0x20);
    std::operator<<((ostream *)a,".\n");
    poVar2 = (ostream *)std::ostream::operator<<(local_198,std::boolalpha);
    poVar2 = std::operator<<(poVar2,"");
    std::operator<<(poVar2,"\n");
    uVar3 = __cxa_allocate_exception(0x30);
    std::__cxx11::ostringstream::str();
    fatal_error::fatal_error((fatal_error *)poVar1,t,a);
    __cxa_throw(uVar3,&fatal_error::typeinfo,fatal_error::~fatal_error);
  }
  return;
}

Assistant:

con_(
            num_con_outputs o
        ) : 
            learning_rate_multiplier(1),
            weight_decay_multiplier(1),
            bias_learning_rate_multiplier(1),
            bias_weight_decay_multiplier(0),
            num_filters_(o.num_outputs),
            padding_y_(_padding_y),
            padding_x_(_padding_x),
            use_bias(true),
            use_relu(false)
        {
            DLIB_CASSERT(num_filters_ > 0);
        }